

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

void __thiscall IZDeflate::bi_windup(IZDeflate *this)

{
  uint uVar1;
  IZDeflate *this_local;
  
  if (this->bi_valid < 9) {
    if (0 < this->bi_valid) {
      if (this->out_size <= this->out_offset) {
        flush_outbuf(this->out_buf,&this->out_offset);
      }
      uVar1 = this->out_offset;
      this->out_offset = uVar1 + 1;
      this->out_buf[uVar1] = (char)this->bi_buf;
    }
  }
  else {
    if (this->out_size - 1 <= this->out_offset) {
      flush_outbuf(this->out_buf,&this->out_offset);
    }
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (char)this->bi_buf;
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (char)(this->bi_buf >> 8);
    this->bi_valid = this->bi_valid + -8;
  }
  if (this->flush_flg != 0) {
    flush_outbuf(this->out_buf,&this->out_offset);
  }
  this->last_bits = this->bi_valid;
  if (this->last_bits == 0) {
    this->last_bits = 8;
  }
  this->bi_buf = 0;
  this->bi_valid = 0;
  return;
}

Assistant:

void IZDeflate::bi_windup()
{
    if (bi_valid > 8) {
        PUTSHORT(bi_buf);
        bi_valid -= 8;
    } else if (bi_valid > 0) {
        PUTBYTE(bi_buf);
    }
    if (flush_flg) {
        flush_outbuf(out_buf, &out_offset);
    }

    last_bits = bi_valid;
    if(last_bits == 0)
      last_bits = 8;

    bi_buf = 0;
    bi_valid = 0;
#ifdef DEBUG
    bits_sent = (bits_sent+7) & ~7;
#endif
}